

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob_detection.cpp
# Opt level: O2

void __thiscall Blob_Detection::BlobInfo::_getHeight(BlobInfo *this)

{
  uint uVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> _Var2
  ;
  
  if (((this->_contourY).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start !=
       (this->_contourY).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish) && ((this->_height).found == false)) {
    _Var2 = std::
            __max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      ();
    uVar1 = *_Var2._M_current;
    _Var2 = std::
            __min_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      ((this->_contourY).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (this->_contourY).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    (this->_height).value = (uVar1 - *_Var2._M_current) + 1;
    (this->_height).found = true;
  }
  return;
}

Assistant:

void BlobInfo::_getHeight()
    {
        if( !_contourY.empty() && !_height.found ) {
            _height.value = *(std::max_element( _contourY.begin(), _contourY.end() )) -
                *(std::min_element( _contourY.begin(), _contourY.end() )) + 1;

            _height.found = true;
        }
    }